

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cereal.hpp
# Opt level: O0

void __thiscall
cereal::InputArchive<cereal::PortableBinaryInputArchive,_1U>::InputArchive
          (InputArchive<cereal::PortableBinaryInputArchive,_1U> *this,
          PortableBinaryInputArchive *derived)

{
  _func_int **in_RSI;
  InputArchiveBase *in_RDI;
  
  detail::InputArchiveBase::InputArchiveBase(in_RDI);
  in_RDI->_vptr_InputArchiveBase = (_func_int **)&PTR__InputArchive_005d6518;
  in_RDI[1]._vptr_InputArchiveBase = in_RSI;
  memset(in_RDI + 2,0,0x38);
  std::
  unordered_set<cereal::traits::detail::base_class_id,_cereal::traits::detail::base_class_id_hash,_std::equal_to<cereal::traits::detail::base_class_id>,_std::allocator<cereal::traits::detail::base_class_id>_>
  ::unordered_set((unordered_set<cereal::traits::detail::base_class_id,_cereal::traits::detail::base_class_id_hash,_std::equal_to<cereal::traits::detail::base_class_id>,_std::allocator<cereal::traits::detail::base_class_id>_>
                   *)0x359a56);
  memset(in_RDI + 9,0,0x38);
  std::
  unordered_map<unsigned_int,_std::shared_ptr<void>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<void>_>_>_>
  ::unordered_map((unordered_map<unsigned_int,_std::shared_ptr<void>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<void>_>_>_>
                   *)0x359a7a);
  memset(in_RDI + 0x10,0,0x38);
  std::
  unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x359aa1);
  memset(in_RDI + 0x17,0,0x38);
  std::
  unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
  ::unordered_map((unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
                   *)0x359ac8);
  return;
}

Assistant:

InputArchive(ArchiveType * const derived) :
        self(derived),
        itsBaseClassSet(),
        itsSharedPointerMap(),
        itsPolymorphicTypeMap(),
        itsVersionedTypes()
      { }